

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O0

void Imf_3_2::loadFlatTiledImage(string *fileName,Header *hdr,FlatImage *img)

{
  uint uVar1;
  Image *pIVar2;
  bool bVar3;
  int iVar4;
  LevelMode LVar5;
  int iVar6;
  char *pcVar7;
  FlatImage *img_00;
  undefined8 uVar8;
  long lVar9;
  Attribute *pAVar10;
  Image *in_RDX;
  Image *in_RSI;
  ConstIterator i_1;
  int x_1;
  int y;
  int x;
  ConstIterator i;
  ChannelList *cl;
  TiledInputFile in;
  string *in_stack_fffffffffffffe78;
  Image *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  allocator<char> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  TiledInputFile *this;
  TiledInputFile *in_stack_ffffffffffffff70;
  int local_80;
  int local_7c;
  int local_78;
  allocator<char> local_71;
  string local_70 [32];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_30;
  TiledInputFile local_28 [16];
  Image *local_18;
  Image *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar4 = Imf_3_2::globalThreadCount();
  this = local_28;
  Imf_3_2::TiledInputFile::TiledInputFile(this,pcVar7,iVar4);
  img_00 = (FlatImage *)Imf_3_2::TiledInputFile::header();
  local_30 = Imf_3_2::Header::channels();
  Image::clearChannels((Image *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  local_48 = Imf_3_2::ChannelList::begin();
  while( true ) {
    local_50 = Imf_3_2::ChannelList::end();
    bVar3 = operator!=((ConstIterator *)in_stack_fffffffffffffe80,
                       (ConstIterator *)in_stack_fffffffffffffe78);
    pIVar2 = local_18;
    if (!bVar3) break;
    ChannelList::ConstIterator::name((ConstIterator *)0x12d8fe);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb0);
    ChannelList::ConstIterator::channel((ConstIterator *)0x12d949);
    Image::insertChannel(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(Channel *)0x12d970);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffe80);
  }
  Imf_3_2::TiledInputFile::header();
  uVar8 = Imf_3_2::Header::dataWindow();
  Imf_3_2::TiledInputFile::header();
  lVar9 = Imf_3_2::Header::tileDescription();
  uVar1 = *(uint *)(lVar9 + 8);
  Imf_3_2::TiledInputFile::header();
  lVar9 = Imf_3_2::Header::tileDescription();
  (*pIVar2->_vptr_Image[2])(pIVar2,uVar8,(ulong)uVar1,(ulong)*(uint *)(lVar9 + 0xc));
  LVar5 = Image::levelMode(local_18);
  if (LVar5 == ONE_LEVEL) {
    anon_unknown_27::loadLevel
              (in_stack_ffffffffffffff70,img_00,(int)((ulong)this >> 0x20),(int)this);
  }
  else if (LVar5 == MIPMAP_LEVELS) {
    for (local_78 = 0;
        iVar4 = Image::numLevels((Image *)CONCAT17(in_stack_fffffffffffffe97,
                                                   in_stack_fffffffffffffe90)), local_78 < iVar4;
        local_78 = local_78 + 1) {
      anon_unknown_27::loadLevel
                (in_stack_ffffffffffffff70,img_00,(int)((ulong)this >> 0x20),(int)this);
    }
  }
  else if (LVar5 == RIPMAP_LEVELS) {
    local_7c = 0;
    while (iVar4 = local_7c, iVar6 = Image::numYLevels((Image *)0x12dbaf), iVar4 < iVar6) {
      local_80 = 0;
      while (iVar4 = local_80, iVar6 = Image::numXLevels((Image *)0x12dbe8), iVar4 < iVar6) {
        anon_unknown_27::loadLevel
                  (in_stack_ffffffffffffff70,img_00,(int)((ulong)this >> 0x20),(int)this);
        local_80 = local_80 + 1;
      }
      local_7c = local_7c + 1;
    }
  }
  Imf_3_2::TiledInputFile::header();
  Imf_3_2::Header::begin();
  while( true ) {
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::end();
    bVar3 = operator!=((ConstIterator *)in_stack_fffffffffffffe80,
                       (ConstIterator *)in_stack_fffffffffffffe78);
    if (!bVar3) break;
    in_stack_fffffffffffffe80 = local_10;
    pAVar10 = (Attribute *)Header::ConstIterator::name((ConstIterator *)0x12dcf3);
    in_stack_fffffffffffffe78 =
         (string *)Header::ConstIterator::attribute((ConstIterator *)0x12dd07);
    Imf_3_2::Header::insert((char *)in_stack_fffffffffffffe80,pAVar10);
    Header::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffe80);
  }
  Imf_3_2::TiledInputFile::~TiledInputFile(local_28);
  return;
}

Assistant:

void
loadFlatTiledImage (const string& fileName, Header& hdr, FlatImage& img)
{
    TiledInputFile in (fileName.c_str ());

    const ChannelList& cl = in.header ().channels ();

    img.clearChannels ();

    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
        img.insertChannel (i.name (), i.channel ());

    img.resize (
        in.header ().dataWindow (),
        in.header ().tileDescription ().mode,
        in.header ().tileDescription ().roundingMode);

    switch (img.levelMode ())
    {
        case ONE_LEVEL: loadLevel (in, img, 0, 0); break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < img.numLevels (); ++x)
                loadLevel (in, img, x, x);

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < img.numYLevels (); ++y)
                for (int x = 0; x < img.numXLevels (); ++x)
                    loadLevel (in, img, x, y);

            break;

        default: assert (false);
    }

    for (Header::ConstIterator i = in.header ().begin ();
         i != in.header ().end ();
         ++i)
    {
        hdr.insert (i.name (), i.attribute ());
    }
}